

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O1

int menu_item_accel_offset_proc(Am_Object *self)

{
  Am_Value *in_value;
  Am_Widget_Look look;
  Am_Widget_Look local_c;
  
  in_value = Am_Object::Get(self,0x17f,0);
  local_c.value = Am_MOTIF_LOOK_val;
  if ((in_value->type != 1) && (in_value->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&local_c,in_value);
  }
  local_c.value = SUB84(in_value->value,0);
  if (local_c.value < (Am_MACINTOSH_LOOK_val|Am_WINDOWS_LOOK_val)) {
    return *(int *)(&DAT_0028e3d0 +
                   (ulong)(local_c.value & (Am_MACINTOSH_LOOK_val|Am_WINDOWS_LOOK_val)) * 4);
  }
  Am_Error("Unknown Look parameter");
}

Assistant:

Am_Define_Formula(int, menu_item_accel_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    return 16;

  case Am_WINDOWS_LOOK_val:
    return 9;

  case Am_MACINTOSH_LOOK_val:
    return 11;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
  return 6; // we should never get here
}